

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computeDual(HEkk *this)

{
  double dVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  long in_RDI;
  HighsInt i_2;
  HighsInt i_1;
  HVector dual_row;
  HighsInt i;
  HighsInt num_tot;
  bool debug_compute_dual;
  double value;
  HighsInt iRow;
  HVector dual_col;
  HVectorBase<double> *in_stack_fffffffffffffe10;
  HVector *in_stack_fffffffffffffe18;
  HEkk *in_stack_fffffffffffffe20;
  HVector *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int local_198;
  int local_194;
  HVector local_190;
  int local_dc;
  int local_d8;
  undefined1 local_d1;
  value_type local_d0;
  int local_c8;
  int local_b4;
  vector<int,_std::allocator<int>_> vStack_b0;
  vector<double,_std::allocator<double>_> avStack_98 [6];
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)in_stack_fffffffffffffe20,
             (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (HighsInt)in_stack_fffffffffffffe18);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffe10);
  HVectorBase<double>::setup
            ((HVectorBase<double> *)in_stack_fffffffffffffe20,
             (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  HVectorBase<double>::clear
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x219c); local_c8 = local_c8 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_c8);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)*pvVar3);
    dVar1 = *pvVar4;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_c8);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),(long)*pvVar3);
    local_d0 = dVar1 + *pvVar4;
    if ((local_d0 != 0.0) || (NAN(local_d0))) {
      __n = (size_type)local_b4;
      in_stack_fffffffffffffe34 = local_c8;
      local_b4 = local_b4 + 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_b0,__n);
      vVar2 = local_d0;
      *pvVar3 = in_stack_fffffffffffffe34;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](avStack_98,(long)local_c8);
      *pvVar4 = vVar2;
    }
  }
  local_d1 = 0;
  local_d8 = *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c);
  for (local_dc = 0; local_dc < local_d8; local_dc = local_dc + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)local_dc)
    ;
    in_stack_fffffffffffffe20 = (HEkk *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),(long)local_dc)
    ;
    in_stack_fffffffffffffe28 = (HVector *)((double)in_stack_fffffffffffffe20 + *pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),(long)local_dc)
    ;
    *pvVar4 = (value_type)in_stack_fffffffffffffe28;
  }
  if (local_b4 != 0) {
    fullBtran(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = &local_190;
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffffe10);
    HVectorBase<double>::setup
              ((HVectorBase<double> *)in_stack_fffffffffffffe20,
               (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    fullPrice((HEkk *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
              in_stack_fffffffffffffe28,(HVector *)in_stack_fffffffffffffe20);
    for (local_194 = 0; local_194 < *(int *)(in_RDI + 0x2198); local_194 = local_194 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_190.array,(long)local_194);
      in_stack_fffffffffffffe10 = (HVectorBase<double> *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_194);
      *pvVar4 = *pvVar4 - (double)in_stack_fffffffffffffe10;
    }
    for (local_198 = *(int *)(in_RDI + 0x2198); local_198 < local_d8; local_198 = local_198 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (avStack_98,(long)(local_198 - *(int *)(in_RDI + 0x2198)));
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_198);
      *pvVar4 = *pvVar4 - dVar1;
    }
    HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffe10);
  }
  *(undefined4 *)(in_RDI + 0x28f0) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x28f8) = 0x7ff0000000000000;
  *(undefined8 *)(in_RDI + 0x2900) = 0x7ff0000000000000;
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)in_stack_fffffffffffffe20,
             (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (HighsInt)in_stack_fffffffffffffe18);
  HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffe10);
  return;
}

Assistant:

void HEkk::computeDual() {
  analysis_.simplexTimerStart(ComputeDualClock);
  // Create a local buffer for the pi vector
  HVector dual_col;
  dual_col.setup(lp_.num_row_);
  dual_col.clear();
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    const double value = info_.workCost_[basis_.basicIndex_[iRow]] +
                         info_.workShift_[basis_.basicIndex_[iRow]];
    if (value) {
      dual_col.index[dual_col.count++] = iRow;
      dual_col.array[iRow] = value;
    }
  }
  // If debugging, save the current duals
  const bool debug_compute_dual = false;
  if (debug_compute_dual) {
    debugComputeDual(true);
    debugSimplexDualInfeasible("(old duals)", true);
  }
  // Copy the costs in case the basic costs are all zero
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt i = 0; i < num_tot; i++)
    info_.workDual_[i] = info_.workCost_[i] + info_.workShift_[i];

  if (dual_col.count) {
    fullBtran(dual_col);
    // Create a local buffer for the values of reduced costs
    HVector dual_row;
    dual_row.setup(lp_.num_col_);
    fullPrice(dual_col, dual_row);
    for (HighsInt i = 0; i < lp_.num_col_; i++)
      info_.workDual_[i] -= dual_row.array[i];
    for (HighsInt i = lp_.num_col_; i < num_tot; i++)
      info_.workDual_[i] -= dual_col.array[i - lp_.num_col_];
    if (debug_compute_dual) {
      debugComputeDual();
      debugSimplexDualInfeasible("(new duals)", true);
    }
  }
  // Indicate that the dual infeasibility information isn't known
  info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;

  analysis_.simplexTimerStop(ComputeDualClock);
}